

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void guards_follow_suspicious_character(tgestate_t *state,vischar_t *vischar)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  vischar_t *pvVar5;
  bool bVar6;
  
  if ((vischar->character != '\0') && (state->vischars[0].mi.sprite == sprites + 0x16)) {
    return;
  }
  if (vischar->flags == '\x04') {
    return;
  }
  if (state->room_index == '\0') {
    lVar4 = 0;
    do {
      *(char *)((long)state->roomdef_object_bounds + lVar4 + -0xe) =
           (char)((&(vischar->mi).mappos.u)[lVar4] + 4 >> 3);
      lVar4 = lVar4 + 1;
    } while ((char)lVar4 != '\x03');
    if ((vischar->direction & 1) == 0) {
      bVar1 = (state->mappos_stash).v;
      bVar2 = (state->hero_mappos).v;
      if (bVar1 + 1 < (uint)bVar2 || bVar2 < bVar1) {
        return;
      }
      bVar6 = (state->mappos_stash).u < (state->hero_mappos).u;
    }
    else {
      bVar1 = (state->mappos_stash).u;
      bVar2 = (state->hero_mappos).u;
      if (bVar1 + 1 < (uint)bVar2 || bVar2 < bVar1) {
        return;
      }
      bVar6 = (state->mappos_stash).v < (state->hero_mappos).v;
    }
    if ((bool)((vischar->direction & 2) == 0 ^ bVar6)) {
      return;
    }
  }
  if (state->red_flag == '\0') {
    if ((vischar->mi).mappos.w < 0x20) {
      vischar->flags = '\x02';
      return;
    }
  }
  else {
    state->bell = '\0';
    pvVar5 = state->vischars;
    cVar3 = -7;
    do {
      pvVar5 = pvVar5 + 1;
      if ((pvVar5->character < 0x14) && ((pvVar5->mi).mappos.w < 0x20)) {
        pvVar5->flags = '\x01';
      }
      cVar3 = cVar3 + '\x01';
    } while (cVar3 != '\0');
  }
  return;
}

Assistant:

void guards_follow_suspicious_character(tgestate_t *state,
                                        vischar_t  *vischar)
{
  character_t  character;    /* was A */
  mappos8_t   *mappos_stash; /* was DE */
  mappos16_t  *mappos;       /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  /* Conv: Copy of vischar in HL factored out. */

  character = vischar->character;

  /* Wearing the uniform stops anyone but the commandant from pursuing the
   * hero. */
  if (character != character_0_COMMANDANT &&
      state->vischars[0].mi.sprite == &sprites[sprite_GUARD_FACING_AWAY_1])
    return;

  /* If this (hostile) character saw the bribe being used then ignore the
   * hero. */
  if (vischar->flags == vischar_PURSUIT_SAW_BRIBE)
    return;

  /* Do line of sight checking when outdoors. */

  mappos = &vischar->mi.mappos; /* was HL += 15 */
  mappos_stash = &state->mappos_stash; // TODO: Find out if this use of mappos_stash ever intersects with the use of mappos_stash for the mask rendering.
  if (state->room_index == room_0_OUTDOORS)
  {
    mappos8_t *hero_mappos; /* was HL */
    int        dir;         /* Conv: was carry */
    uint8_t    direction;   /* was A / C */

    scale_mappos_down(mappos, mappos_stash); // stash_pos = vischar.mi.pos

    hero_mappos = &state->hero_mappos;
    /* Conv: Dupe pos pointer factored out. */

    direction = vischar->direction; /* This character's direction. */
    /* Conv: Avoided shifting 'direction' here. Propagated shift into later ops. */

    if ((direction & 1) == 0)
    {
      /* TL or BR */

      /* Does the hero approximately match our Y coordinate? */
      if (mappos_stash->v - 1 >= hero_mappos->v ||
          mappos_stash->v + 1 <  hero_mappos->v)
        return;

      /* Are we facing the hero? */
      dir = mappos_stash->u < hero_mappos->u;
      if ((direction & 2) == 0)
        dir = !dir;
      if (dir)
        return;
    }
    else
    {
      /* TR or BL */

      /* Does the hero approximately match our X coordinate? */
      if (mappos_stash->u - 1 >= hero_mappos->u ||
          mappos_stash->u + 1 <  hero_mappos->u)
        return;

      /* Are we facing the hero? */
      dir = mappos_stash->v < hero_mappos->v;
      if ((direction & 2) == 0)
        dir = !dir;
      if (dir)
        return;
    }
  }

  if (!state->red_flag)
  {
    /* Hostiles *not* in guard towers hassle the hero. */
    if (vischar->mi.mappos.w < 32) /* uses A as temporary */
      vischar->flags = vischar_PURSUIT_HASSLE;
  }
  else
  {
    state->bell = bell_RING_PERPETUAL;
    hostiles_pursue(state);
  }
}